

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

void __thiscall
HighsSplitDeque::waitForTaskToFinish(HighsSplitDeque *this,HighsTask *t,HighsSplitDeque *stealer)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  unique_lock<std::mutex> lg;
  unique_lock<std::mutex> local_48;
  unique_lock<std::mutex> local_38;
  
  local_48._M_device =
       (mutex_type *)
       ((long)(this->stealerData).semaphore.data_._M_t.
              super___uniq_ptr_impl<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
              ._M_t.
              super__Tuple_impl<0UL,_HighsBinarySemaphore::Data_*,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
              .super__Head_base<0UL,_HighsBinarySemaphore::Data_*,_false> + 0x40);
  local_48._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  uVar1 = (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  do {
    LOCK();
    uVar2 = (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
    bVar3 = uVar1 == uVar2;
    if (bVar3) {
      (t->metadata).stealer.super___atomic_base<unsigned_long>._M_i =
           uVar1 ^ (ulong)stealer ^ (ulong)this;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar3);
  if ((uVar2 & 1) == 0) {
    local_38._M_device = local_48._M_device;
    local_38._M_owns = true;
    local_48._M_device = (mutex_type *)0x0;
    local_48._M_owns = false;
    HighsBinarySemaphore::acquire(&(this->stealerData).semaphore,&local_38);
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return;
}

Assistant:

void waitForTaskToFinish(HighsTask* t, HighsSplitDeque* stealer) {
    std::unique_lock<std::mutex> lg =
        stealerData.semaphore.lockMutexForAcquire();
    // exchange the value stored in stealer with the pointer to owner
    // so that the stealer will see this pointer instead of nullptr
    // when it stores whether the task is finished. In that case the
    // stealer will additionally acquire the wait mutex and signal the owner
    // thread that the task is finished

    if (!t->requestNotifyWhenFinished(this, stealer)) return;

    stealerData.semaphore.acquire(std::move(lg));
  }